

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDtdPtr xmlCreateIntSubset(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  _xmlNode *p_Var1;
  xmlDtdPtr pxVar2;
  xmlChar *pxVar3;
  xmlRegisterNodeFunc *pp_Var4;
  bool bVar5;
  _xmlNode *local_48;
  xmlNodePtr next;
  xmlNodePtr prev;
  xmlDtdPtr cur;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if ((doc != (xmlDocPtr)0x0) && (pxVar2 = xmlGetIntSubset(doc), pxVar2 != (xmlDtdPtr)0x0)) {
    return pxVar2;
  }
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x80);
  if (doc_local == (xmlDocPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  memset(doc_local,0,0x80);
  doc_local->type = XML_DTD_NODE;
  if (name == (xmlChar *)0x0) {
LAB_00161110:
    if (ExternalID != (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(ExternalID);
      doc_local->version = pxVar3;
      if (doc_local->version == (xmlChar *)0x0) goto LAB_00161301;
    }
    if (SystemID != (xmlChar *)0x0) {
      pxVar3 = xmlStrdup(SystemID);
      doc_local->encoding = pxVar3;
      if (doc_local->encoding == (xmlChar *)0x0) goto LAB_00161301;
    }
    if (doc != (xmlDocPtr)0x0) {
      doc->intSubset = (_xmlDtd *)doc_local;
      doc_local->parent = (_xmlNode *)doc;
      doc_local->doc = doc;
      if (doc->children == (_xmlNode *)0x0) {
        doc->children = (_xmlNode *)doc_local;
        doc->last = (_xmlNode *)doc_local;
      }
      else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        p_Var1 = doc->children;
        p_Var1->prev = (_xmlNode *)doc_local;
        doc_local->next = p_Var1;
        doc->children = (_xmlNode *)doc_local;
      }
      else {
        local_48 = doc->children;
        while( true ) {
          bVar5 = false;
          if (local_48 != (_xmlNode *)0x0) {
            bVar5 = local_48->type != XML_ELEMENT_NODE;
          }
          if (!bVar5) break;
          local_48 = local_48->next;
        }
        if (local_48 == (_xmlNode *)0x0) {
          doc_local->prev = doc->last;
          doc_local->prev->next = (_xmlNode *)doc_local;
          doc_local->next = (_xmlNode *)0x0;
          doc->last = (_xmlNode *)doc_local;
        }
        else {
          doc_local->next = local_48;
          doc_local->prev = local_48->prev;
          if (doc_local->prev == (_xmlNode *)0x0) {
            doc->children = (_xmlNode *)doc_local;
          }
          else {
            doc_local->prev->next = (_xmlNode *)doc_local;
          }
          local_48->prev = (_xmlNode *)doc_local;
        }
      }
    }
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var4 = __xmlRegisterNodeDefaultValue(), *pp_Var4 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var4 = __xmlRegisterNodeDefaultValue();
      (**pp_Var4)((xmlNodePtr)doc_local);
    }
  }
  else {
    pxVar3 = xmlStrdup(name);
    doc_local->name = (char *)pxVar3;
    if ((xmlChar *)doc_local->name != (xmlChar *)0x0) goto LAB_00161110;
LAB_00161301:
    xmlFreeDtd((xmlDtdPtr)doc_local);
    doc_local = (xmlDocPtr)0x0;
  }
  return (xmlDtdPtr)doc_local;
}

Assistant:

xmlDtdPtr
xmlCreateIntSubset(xmlDocPtr doc, const xmlChar *name,
                   const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if (doc != NULL) {
        cur = xmlGetIntSubset(doc);
        if (cur != NULL)
            return(cur);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL) {
	cur->name = xmlStrdup(name);
	if (cur->name == NULL)
            goto error;
    }
    if (ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ExternalID);
	if (cur->ExternalID  == NULL)
            goto error;
    }
    if (SystemID != NULL) {
	cur->SystemID = xmlStrdup(SystemID);
	if (cur->SystemID == NULL)
            goto error;
    }
    if (doc != NULL) {
	doc->intSubset = cur;
	cur->parent = doc;
	cur->doc = doc;
	if (doc->children == NULL) {
	    doc->children = (xmlNodePtr) cur;
	    doc->last = (xmlNodePtr) cur;
	} else {
	    if (doc->type == XML_HTML_DOCUMENT_NODE) {
		xmlNodePtr prev;

		prev = doc->children;
		prev->prev = (xmlNodePtr) cur;
		cur->next = prev;
		doc->children = (xmlNodePtr) cur;
	    } else {
		xmlNodePtr next;

		next = doc->children;
		while ((next != NULL) && (next->type != XML_ELEMENT_NODE))
		    next = next->next;
		if (next == NULL) {
		    cur->prev = doc->last;
		    cur->prev->next = (xmlNodePtr) cur;
		    cur->next = NULL;
		    doc->last = (xmlNodePtr) cur;
		} else {
		    cur->next = next;
		    cur->prev = next->prev;
		    if (cur->prev == NULL)
			doc->children = (xmlNodePtr) cur;
		    else
			cur->prev->next = (xmlNodePtr) cur;
		    next->prev = (xmlNodePtr) cur;
		}
	    }
	}
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);

error:
    xmlFreeDtd(cur);
    return(NULL);
}